

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsqldatabase.cpp
# Opt level: O0

QSqlDatabase QSqlDatabase::cloneDatabase(QSqlDatabase *other,QString *connectionName)

{
  long lVar1;
  bool bVar2;
  QSqlDatabase *in_RDX;
  EVP_PKEY_CTX *src;
  undefined8 *in_RSI;
  QSqlDatabasePrivate *in_RDI;
  long in_FS_OFFSET;
  QSqlDatabase *db;
  QSqlDatabase *in_stack_ffffffffffffffa8;
  QSqlDatabasePrivate *type;
  undefined7 in_stack_ffffffffffffffc0;
  undefined1 in_stack_ffffffffffffffc7;
  undefined1 uVar3;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  type = in_RDI;
  bVar2 = isValid((QSqlDatabase *)CONCAT17(in_stack_ffffffffffffffc7,in_stack_ffffffffffffffc0));
  if (bVar2) {
    uVar3 = 0;
    *(undefined8 *)in_RDI = 0xaaaaaaaaaaaaaaaa;
    driverName(in_stack_ffffffffffffffa8);
    QSqlDatabase((QSqlDatabase *)CONCAT17(uVar3,in_stack_ffffffffffffffc0),(QString *)type);
    QString::~QString((QString *)0x11e858);
    QSqlDatabasePrivate::copy(*(QSqlDatabasePrivate **)in_RDI,(EVP_PKEY_CTX *)*in_RSI,src);
    QSqlDatabasePrivate::addDatabase(in_RDX,(QString *)CONCAT17(uVar3,in_stack_ffffffffffffffc0));
  }
  else {
    QSqlDatabase((QSqlDatabase *)in_RDI);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return (QSqlDatabase)type;
}

Assistant:

QSqlDatabase QSqlDatabase::cloneDatabase(const QSqlDatabase &other, const QString &connectionName)
{
    if (!other.isValid())
        return QSqlDatabase();

    QSqlDatabase db(other.driverName());
    db.d->copy(other.d);
    QSqlDatabasePrivate::addDatabase(db, connectionName);
    return db;
}